

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O2

void __thiscall
BitField_IsolationFromOtherBitfields_Test::BitField_IsolationFromOtherBitfields_Test
          (BitField_IsolationFromOtherBitfields_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0020e110;
  return;
}

Assistant:

TEST (BitField, IsolationFromOtherBitfields) {
    union {
        std::uint8_t value;
        pstore::bit_field<std::uint8_t, 0, 2> f1; // f1 is bits [0-2)
        pstore::bit_field<std::uint8_t, 2, 6> f2; // f2 is bits [2-8)
    };

    value = 0;
    EXPECT_EQ (f1, 0U);
    EXPECT_EQ (f2, 0U);

    f1 = decltype (f1)::max ();
    EXPECT_EQ (f1, decltype (f1)::max ());
    EXPECT_EQ (f2, 0x00U);

    f1 = std::uint8_t{0};
    f2 = decltype (f2)::max ();
    EXPECT_EQ (f2, decltype (f2)::max ());
    EXPECT_EQ (f1, 0x00U);

    EXPECT_EQ (value, 0xFC);
}